

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assertion_tests.cpp
# Opt level: O0

void __thiscall
iu_AssertionTest_x_iutest_x_Complex_Test::iu_AssertionTest_x_iutest_x_Complex_Test
          (iu_AssertionTest_x_iutest_x_Complex_Test *this)

{
  iu_AssertionTest_x_iutest_x_Complex_Test *this_local;
  
  iutest::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test =
       (_func_int **)&PTR__iu_AssertionTest_x_iutest_x_Complex_Test_006112c8;
  return;
}

Assistant:

IUTEST(AssertionTest, Complex)
{
    ::std::complex<float> cf0(0.0f, 2.0f);
    ::std::complex<float> cf1(1.0f, 0.0f);
    ::std::complex<double> cd1(1.0, 0.0);
    IUTEST_ASSERT_COMPLEX_EQ(::std::complex<float>(1.0f, 0.0f), cf1);
    IUTEST_EXPECT_COMPLEX_EQ(::std::complex<float>(0.0f, 2.0f), cf0);
    IUTEST_INFORM_COMPLEX_EQ(1.0f, cf1);
    IUTEST_INFORM_COMPLEX_EQ(cf1, 1.0f);
    IUTEST_INFORM_COMPLEX_EQ(cf1, cd1);
}